

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

void __thiscall
JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
          (JointPolicyPureVectorForClusteredBG *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *pu,PolicyDomainCategory idc,
          JPPVfCBG_constPtr *prevJPolBG,double r)

{
  int *piVar1;
  sp_counted_base *psVar2;
  sp_counted_base *psVar3;
  undefined8 *puVar4;
  BGwCI_constPtr bg;
  shared_ptr<const_BayesianGameWithClusterInfo> local_38;
  
  psVar2 = (pu->pn).pi_;
  local_38.px = (element_type *)pu->px;
  local_38.pn.pi_ = (pu->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  PartialJointPolicyPureVector::PartialJointPolicyPureVector
            (&this->super_PartialJointPolicyPureVector,(I_PtPDpure_constPtr *)&local_38,TYPE_INDEX,r
             ,999999);
  boost::detail::shared_count::~shared_count(&local_38.pn);
  (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
  super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005a1930;
  (this->super_PartialJointPolicyPureVector).super_JPolComponent_VectorImplementation.
  _vptr_JPolComponent_VectorImplementation = (_func_int **)&DAT_005a1a18;
  (this->_m_bg).px = (element_type *)0x0;
  (this->_m_bg).pn.pi_ = (sp_counted_base *)0x0;
  psVar2 = (prevJPolBG->pn).pi_;
  psVar3 = (prevJPolBG->pn).pi_;
  (this->_m_prevJPolBG).px = prevJPolBG->px;
  (this->_m_prevJPolBG).pn.pi_ = psVar3;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  if (idc == TYPE_INDEX) {
    boost::
    dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
              ((boost *)&local_38,pu);
    if (local_38.px != (element_type *)0x0) {
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(&this->_m_bg,&local_38);
      boost::detail::shared_count::~shared_count(&local_38.pn);
      return;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar4 = &PTR__E_0059bd80;
    puVar4[1] = puVar4 + 3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar4 + 1),
               "JointPolicyPureVectorForClusteredBG can only be constructed with a BayesianGameWithClusterInfo"
               ,"");
    __cxa_throw(puVar4,&E::typeinfo,E::~E);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar4 = &PTR__E_0059bd80;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar4 + 1),
             "JointPolicyPureVectorForClusteredBG should have TYPE_INDEX as domain category","");
  __cxa_throw(puVar4,&E::typeinfo,E::~E);
}

Assistant:

JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG(
        const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &pu,
        PolicyGlobals::PolicyDomainCategory idc,
        JPPVfCBG_constPtr prevJPolBG,
        double r)
    : 
    PartialJointPolicyPureVector( pu, PolicyGlobals::TYPE_INDEX, r ),
    _m_bg(),
    _m_prevJPolBG(prevJPolBG)
{
    if(idc!=PolicyGlobals::TYPE_INDEX)
        throw(E("JointPolicyPureVectorForClusteredBG should have TYPE_INDEX as domain category"));

    BGwCI_constPtr bg = boost::dynamic_pointer_cast<const BayesianGameWithClusterInfo>(pu);
    if(bg==0)
        throw(E("JointPolicyPureVectorForClusteredBG can only be constructed with a BayesianGameWithClusterInfo"));
    _m_bg=bg;
}